

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Imputer::SharedDtor(Imputer *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/Imputer.pb.cc"
               ,0xf1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if (this->_oneof_case_[0] != 0) {
    clear_ImputedValue(this);
  }
  if (this->_oneof_case_[1] != 0) {
    clear_ReplaceValue(this);
  }
  return;
}

Assistant:

inline void Imputer::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (has_ImputedValue()) {
    clear_ImputedValue();
  }
  if (has_ReplaceValue()) {
    clear_ReplaceValue();
  }
}